

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::anon_unknown_60::CompareSortKeys<google::protobuf::Descriptor>
               (Descriptor *a,Descriptor *b)

{
  long lVar1;
  undefined1 *puVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  lVar1 = *(long *)(*(long *)(a + 8) + 0x20);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,lVar1,*(long *)(*(long *)(a + 8) + 0x28) + lVar1);
  lVar1 = *(long *)(*(long *)(b + 8) + 0x20);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar1,*(long *)(*(long *)(b + 8) + 0x28) + lVar1);
  puVar2 = local_50;
  uVar4 = local_68;
  if (local_48 < local_68) {
    uVar4 = local_48;
  }
  if (uVar4 != 0) {
    uVar3 = memcmp(local_70,local_50,uVar4);
    uVar4 = (ulong)uVar3;
    if (uVar3 != 0) goto LAB_002987b9;
  }
  uVar4 = 0xffffffff80000000;
  if (-0x80000000 < (long)(local_68 - local_48)) {
    uVar4 = local_68 - local_48;
  }
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0;
  }
LAB_002987b9:
  if (puVar2 != local_40) {
    operator_delete(puVar2);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return (bool)((byte)(uVar4 >> 0x1f) & 1);
}

Assistant:

bool CompareSortKeys(const T* a, const T* b) {
  return GetSortKey(*a) < GetSortKey(*b);
}